

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O0

jas_cmxform_t *
jas_cmxform_create(jas_cmprof_t *inprof,jas_cmprof_t *outprof,jas_cmprof_t *prfprof,int op,
                  int intent,int optimize)

{
  int iVar1;
  jas_cmpxformseq_t *pjVar2;
  jas_cmpxformseq_t *local_c0;
  jas_cmpxformseq_t *local_b8;
  jas_cmpxformseq_t *local_b0;
  jas_cmpxformseq_t *local_a8;
  jas_cmpxformseq_t *local_a0;
  jas_cmpxformseq_t *local_98;
  jas_cmpxformseq_t *local_90;
  jas_cmpxformseq_t *local_88;
  jas_cmpxformseq_t *local_80;
  jas_cmpxformseq_t *local_78;
  int prfintent;
  jas_cmpxformseq_t *prfpxformseq;
  jas_cmpxformseq_t *altoutpxformseq;
  jas_cmpxformseq_t *outpxformseq;
  jas_cmpxformseq_t *inpxformseq;
  jas_cmxform_t *xform;
  int optimize_local;
  int intent_local;
  int op_local;
  jas_cmprof_t *prfprof_local;
  jas_cmprof_t *outprof_local;
  jas_cmprof_t *inprof_local;
  
  inprof_local = (jas_cmprof_t *)jas_malloc(0x10);
  if (inprof_local != (jas_cmprof_t *)0x0) {
    pjVar2 = jas_cmpxformseq_create();
    *(jas_cmpxformseq_t **)&inprof_local->refclrspc = pjVar2;
    if (pjVar2 != (jas_cmpxformseq_t *)0x0) {
      switch(op) {
      case 0:
        if (inprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
          local_78 = inprof->pxformseqs[0];
        }
        else {
          local_78 = inprof->pxformseqs[intent];
        }
        if (outprof->pxformseqs[intent + 4] == (jas_cmpxformseq_t *)0x0) {
          local_80 = outprof->pxformseqs[4];
        }
        else {
          local_80 = outprof->pxformseqs[intent + 4];
        }
        if ((((local_78 != (jas_cmpxformseq_t *)0x0) && (local_80 != (jas_cmpxformseq_t *)0x0)) &&
            (iVar1 = jas_cmpxformseq_append
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_78),
            iVar1 == 0)) &&
           ((iVar1 = jas_cmpxformseq_appendcnvt
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,inprof->refclrspc,
                                outprof->refclrspc), iVar1 == 0 &&
            (iVar1 = jas_cmpxformseq_append
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_80),
            iVar1 == 0)))) {
          iVar1 = jas_clrspc_numchans(inprof->clrspc);
          inprof_local->clrspc = iVar1;
          iVar1 = jas_clrspc_numchans(outprof->clrspc);
          inprof_local->numchans = iVar1;
          return (jas_cmxform_t *)inprof_local;
        }
        break;
      case 1:
        if (outprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
          local_88 = outprof->pxformseqs[0];
        }
        else {
          local_88 = outprof->pxformseqs[intent];
        }
        if (inprof->pxformseqs[intent + 4] == (jas_cmpxformseq_t *)0x0) {
          local_90 = inprof->pxformseqs[4];
        }
        else {
          local_90 = inprof->pxformseqs[intent + 4];
        }
        if (((local_88 != (jas_cmpxformseq_t *)0x0) && (local_90 != (jas_cmpxformseq_t *)0x0)) &&
           ((iVar1 = jas_cmpxformseq_append
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_88),
            iVar1 == 0 &&
            ((iVar1 = jas_cmpxformseq_appendcnvt
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,outprof->refclrspc,
                                 inprof->refclrspc), iVar1 == 0 &&
             (iVar1 = jas_cmpxformseq_append
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_90),
             iVar1 == 0)))))) {
          iVar1 = jas_clrspc_numchans(outprof->clrspc);
          inprof_local->clrspc = iVar1;
          iVar1 = jas_clrspc_numchans(inprof->clrspc);
          inprof_local->numchans = iVar1;
          return (jas_cmxform_t *)inprof_local;
        }
        break;
      case 2:
        if (prfprof == (jas_cmprof_t *)0x0) {
          __assert_fail("prfprof",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                        ,0x1a2,
                        "jas_cmxform_t *jas_cmxform_create(jas_cmprof_t *, jas_cmprof_t *, jas_cmprof_t *, int, int, int)"
                       );
        }
        if (inprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
          local_98 = inprof->pxformseqs[0];
        }
        else {
          local_98 = inprof->pxformseqs[intent];
        }
        if (prfprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
          local_a0 = prfprof->pxformseqs[0];
        }
        else {
          local_a0 = prfprof->pxformseqs[intent];
        }
        if ((local_98 != (jas_cmpxformseq_t *)0x0) && (local_a0 != (jas_cmpxformseq_t *)0x0)) {
          if (outprof->pxformseqs[intent + 8] == (jas_cmpxformseq_t *)0x0) {
            local_a8 = outprof->pxformseqs[8];
          }
          else {
            local_a8 = outprof->pxformseqs[intent + 8];
          }
          altoutpxformseq = local_a8;
          prfpxformseq = (jas_cmpxformseq_t *)0x0;
          if (local_a8 == (jas_cmpxformseq_t *)0x0) {
            if (outprof->pxformseqs[intent + 4] == (jas_cmpxformseq_t *)0x0) {
              local_b0 = outprof->pxformseqs[4];
            }
            else {
              local_b0 = outprof->pxformseqs[intent + 4];
            }
            altoutpxformseq = local_b0;
            if (outprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
              local_b8 = outprof->pxformseqs[0];
            }
            else {
              local_b8 = outprof->pxformseqs[intent];
            }
            prfpxformseq = local_b8;
            if ((local_b0 == (jas_cmpxformseq_t *)0x0) || (local_b8 == (jas_cmpxformseq_t *)0x0))
            break;
          }
          iVar1 = jas_cmpxformseq_append(*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_98);
          if ((iVar1 == 0) &&
             (iVar1 = jas_cmpxformseq_appendcnvt
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,inprof->refclrspc,
                                 outprof->refclrspc), iVar1 == 0)) {
            if (prfpxformseq == (jas_cmpxformseq_t *)0x0) {
              iVar1 = jas_cmpxformseq_append
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,altoutpxformseq);
            }
            else {
              iVar1 = jas_cmpxformseq_append
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,altoutpxformseq);
              if (iVar1 != 0) break;
              iVar1 = jas_cmpxformseq_append
                                (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,prfpxformseq);
            }
            if (((iVar1 == 0) &&
                (iVar1 = jas_cmpxformseq_appendcnvt
                                   (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,
                                    outprof->refclrspc,inprof->refclrspc), iVar1 == 0)) &&
               (iVar1 = jas_cmpxformseq_append
                                  (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_a0),
               iVar1 == 0)) {
              iVar1 = jas_clrspc_numchans(inprof->clrspc);
              inprof_local->clrspc = iVar1;
              iVar1 = jas_clrspc_numchans(prfprof->clrspc);
              inprof_local->numchans = iVar1;
              return (jas_cmxform_t *)inprof_local;
            }
          }
        }
        break;
      case 3:
        if (inprof->pxformseqs[intent] == (jas_cmpxformseq_t *)0x0) {
          local_c0 = inprof->pxformseqs[0];
        }
        else {
          local_c0 = inprof->pxformseqs[intent];
        }
        pjVar2 = outprof->pxformseqs[0xc];
        if ((((local_c0 != (jas_cmpxformseq_t *)0x0) && (pjVar2 != (jas_cmpxformseq_t *)0x0)) &&
            (iVar1 = jas_cmpxformseq_append
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,local_c0),
            iVar1 == 0)) &&
           ((iVar1 = jas_cmpxformseq_appendcnvt
                               (*(jas_cmpxformseq_t **)&inprof_local->refclrspc,inprof->refclrspc,
                                outprof->refclrspc), iVar1 == 0 &&
            (iVar1 = jas_cmpxformseq_append(*(jas_cmpxformseq_t **)&inprof_local->refclrspc,pjVar2),
            iVar1 == 0)))) {
          iVar1 = jas_clrspc_numchans(inprof->clrspc);
          inprof_local->clrspc = iVar1;
          inprof_local->numchans = 1;
          return (jas_cmxform_t *)inprof_local;
        }
        break;
      default:
        goto switchD_0010c38c_default;
      }
    }
  }
  if (inprof_local != (jas_cmprof_t *)0x0) {
    jas_cmxform_destroy((jas_cmxform_t *)inprof_local);
  }
  inprof_local = (jas_cmprof_t *)0x0;
switchD_0010c38c_default:
  return (jas_cmxform_t *)inprof_local;
}

Assistant:

jas_cmxform_t *jas_cmxform_create(jas_cmprof_t *inprof, jas_cmprof_t *outprof,
  jas_cmprof_t *prfprof, int op, int intent, int optimize)
{
	jas_cmxform_t *xform;
	jas_cmpxformseq_t *inpxformseq;
	jas_cmpxformseq_t *outpxformseq;
	jas_cmpxformseq_t *altoutpxformseq;
	jas_cmpxformseq_t *prfpxformseq;
	int prfintent;

	/* Avoid compiler warnings about unused parameters. */
	(void)optimize;

	prfintent = intent;

	if (!(xform = jas_malloc(sizeof(jas_cmxform_t))))
		goto error;
	if (!(xform->pxformseq = jas_cmpxformseq_create()))
		goto error;

	switch (op) {
	case JAS_CMXFORM_OP_FWD:
		inpxformseq = fwdpxformseq(inprof, intent);
		outpxformseq = revpxformseq(outprof, intent);
		if (!inpxformseq || !outpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(outprof->clrspc);
		break;
	case JAS_CMXFORM_OP_REV:
		outpxformseq = fwdpxformseq(outprof, intent);
		inpxformseq = revpxformseq(inprof, intent);
		if (!outpxformseq || !inpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  outprof->refclrspc, inprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, inpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(outprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(inprof->clrspc);
		break;
	case JAS_CMXFORM_OP_PROOF:
		assert(prfprof);
		inpxformseq = fwdpxformseq(inprof, intent);
		prfpxformseq = fwdpxformseq(prfprof, prfintent);
		if (!inpxformseq || !prfpxformseq)
			goto error;
		outpxformseq = simpxformseq(outprof, intent);
		altoutpxformseq = 0;
		if (!outpxformseq) {
			outpxformseq = revpxformseq(outprof, intent);
			altoutpxformseq = fwdpxformseq(outprof, intent);
			if (!outpxformseq || !altoutpxformseq)
				goto error;
		}
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc))
			goto error;
		if (altoutpxformseq) {
			if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq) ||
			  jas_cmpxformseq_append(xform->pxformseq, altoutpxformseq))
				goto error;
		} else {
			if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
				goto error;
		}
		if (jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  outprof->refclrspc, inprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, prfpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(prfprof->clrspc);
		break;
	case JAS_CMXFORM_OP_GAMUT:
		inpxformseq = fwdpxformseq(inprof, intent);
		outpxformseq = gampxformseq(outprof);
		if (!inpxformseq || !outpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = 1;
		break;
	}
	return xform;
error:
	if (xform)
		jas_cmxform_destroy(xform);
	return 0;
}